

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

Ivy_Man_t * Ivy_FraigPerform(Ivy_Man_t *pManAig,Ivy_FraigParams_t *pParams)

{
  int iVar1;
  Ivy_Man_t *pIVar2;
  Ivy_FraigMan_t *p;
  long lVar3;
  long lVar4;
  timespec ts;
  timespec local_28;
  
  if (pManAig->nObjs[6] + pManAig->nObjs[5] == 0) {
    pIVar2 = Ivy_ManDup(pManAig);
    return pIVar2;
  }
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_28.tv_sec * -1000000;
  }
  if (pManAig->nObjs[4] == 0) {
    p = Ivy_FraigStart(pManAig,pParams);
    Ivy_FraigSimulate(p);
    Ivy_FraigSweep(p);
    pIVar2 = p->pManFraig;
    iVar1 = clock_gettime(3,&local_28);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    p->timeTotal = lVar4 + lVar3;
    Ivy_FraigStop(p);
    return pIVar2;
  }
  __assert_fail("Ivy_ManLatchNum(pManAig) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                ,0x1cb,"Ivy_Man_t *Ivy_FraigPerform(Ivy_Man_t *, Ivy_FraigParams_t *)");
}

Assistant:

Ivy_Man_t * Ivy_FraigPerform( Ivy_Man_t * pManAig, Ivy_FraigParams_t * pParams )
{
    Ivy_FraigMan_t * p;
    Ivy_Man_t * pManAigNew;
    abctime clk;
    if ( Ivy_ManNodeNum(pManAig) == 0 )
        return Ivy_ManDup(pManAig);
clk = Abc_Clock();
    assert( Ivy_ManLatchNum(pManAig) == 0 );
    p = Ivy_FraigStart( pManAig, pParams );
    Ivy_FraigSimulate( p );
    Ivy_FraigSweep( p );
    pManAigNew = p->pManFraig;
p->timeTotal = Abc_Clock() - clk;
    Ivy_FraigStop( p );
    return pManAigNew;
}